

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureCubeFormatCase::init(TextureCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  ostream *poVar2;
  MessageBuilder *pMVar3;
  TextureCube *pTVar4;
  PixelBufferAccess *access;
  Enum<int,_2UL> EVar5;
  TextureCube *local_5a8;
  Vector<float,_4> local_4f8;
  Vector<float,_4> local_4e8;
  Vector<float,_4> local_4d8;
  Vector<float,_4> local_4c8;
  Vector<float,_4> local_4b8;
  Vector<float,_4> local_4a8;
  Vector<float,_4> local_498;
  Vector<float,_4> local_488;
  Vector<float,_4> local_478;
  Vector<float,_4> local_468;
  Vector<float,_4> local_458;
  Vector<float,_4> local_448;
  undefined1 local_438 [8];
  Vec4 gMax;
  Vec4 gMin;
  int face;
  LogGradientFmt local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  MessageBuilder local_3c8;
  GetNameFunc local_248;
  int local_240;
  Enum<int,_2UL> local_238;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1e8;
  ostringstream local_1d8 [8];
  ostringstream fmtName;
  undefined1 local_60 [8];
  TextureFormatInfo spec;
  TextureFormat fmt;
  TestLog *log;
  TextureCubeFormatCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  if (this->m_dataType == 0) {
    spec.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_format);
  }
  else {
    spec.lookupBias.m_data._8_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  }
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)local_60,(TextureFormat *)(spec.lookupBias.m_data + 2));
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  if (this->m_dataType == 0) {
    EVar5 = glu::getTextureFormatStr(this->m_format);
    local_248 = EVar5.m_getName;
    local_240 = EVar5.m_value;
    local_238.m_getName = local_248;
    local_238.m_value = local_240;
    tcu::Format::operator<<((ostream *)local_1d8,&local_238);
  }
  else {
    EVar5 = glu::getTextureFormatStr(this->m_format);
    local_208 = EVar5.m_getName;
    local_200 = EVar5.m_value;
    local_1e8.m_getName = local_208;
    local_1e8.m_value = local_200;
    poVar2 = tcu::Format::operator<<((ostream *)local_1d8,&local_1e8);
    poVar2 = std::operator<<(poVar2,", ");
    EVar5 = glu::getTypeStr(this->m_dataType);
    local_228 = EVar5.m_getName;
    local_220 = EVar5.m_value;
    local_218.m_getName = local_228;
    local_218.m_value = local_220;
    tcu::Format::operator<<(poVar2,&local_218);
  }
  tcu::TestLog::operator<<(&local_3c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_3c8,(char (*) [19])"Cube map texture, ");
  std::__cxx11::ostringstream::str();
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3e8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x12ed2ef);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_width);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12b2071);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_height);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])",\n  fill with ");
  local_3f8 = glu::TextureTestUtil::formatGradient
                        ((Vec4 *)local_60,(Vec4 *)(spec.valueMin.m_data + 2));
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3f8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])0x129e423);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::MessageBuilder::~MessageBuilder(&local_3c8);
  if (this->m_dataType == 0) {
    local_5a8 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(local_5a8,this->m_renderCtx,this->m_format,this->m_width);
  }
  else {
    local_5a8 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (local_5a8,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width);
  }
  this->m_texture = local_5a8;
  for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < 6;
      gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_438);
    switch(gMin.m_data[2]) {
    case 0.0:
      tcu::Vector<float,_4>::swizzle(&local_448,(int)local_60,0,1,2);
      gMax.m_data[2] = local_448.m_data[0];
      gMax.m_data[3] = local_448.m_data[1];
      tcu::Vector<float,_4>::swizzle(&local_458,(int)&spec + 8,0,1,2);
      local_438._0_4_ = local_458.m_data[0];
      local_438._4_4_ = local_458.m_data[1];
      gMax.m_data[0] = local_458.m_data[2];
      gMax.m_data[1] = local_458.m_data[3];
      break;
    case 1.4013e-45:
      tcu::Vector<float,_4>::swizzle(&local_468,(int)local_60,2,1,0);
      gMax.m_data[2] = local_468.m_data[0];
      gMax.m_data[3] = local_468.m_data[1];
      tcu::Vector<float,_4>::swizzle(&local_478,(int)&spec + 8,2,1,0);
      local_438._0_4_ = local_478.m_data[0];
      local_438._4_4_ = local_478.m_data[1];
      gMax.m_data[0] = local_478.m_data[2];
      gMax.m_data[1] = local_478.m_data[3];
      break;
    case 2.8026e-45:
      tcu::Vector<float,_4>::swizzle(&local_488,(int)local_60,1,2,0);
      gMax.m_data[2] = local_488.m_data[0];
      gMax.m_data[3] = local_488.m_data[1];
      tcu::Vector<float,_4>::swizzle(&local_498,(int)&spec + 8,1,2,0);
      local_438._0_4_ = local_498.m_data[0];
      local_438._4_4_ = local_498.m_data[1];
      gMax.m_data[0] = local_498.m_data[2];
      gMax.m_data[1] = local_498.m_data[3];
      break;
    case 4.2039e-45:
      tcu::Vector<float,_4>::swizzle(&local_4a8,(int)&spec + 8,0,1,2);
      gMax.m_data[2] = local_4a8.m_data[0];
      gMax.m_data[3] = local_4a8.m_data[1];
      tcu::Vector<float,_4>::swizzle(&local_4b8,(int)local_60,0,1,2);
      local_438._0_4_ = local_4b8.m_data[0];
      local_438._4_4_ = local_4b8.m_data[1];
      gMax.m_data[0] = local_4b8.m_data[2];
      gMax.m_data[1] = local_4b8.m_data[3];
      break;
    case 5.60519e-45:
      tcu::Vector<float,_4>::swizzle(&local_4c8,(int)&spec + 8,2,1,0);
      gMax.m_data[2] = local_4c8.m_data[0];
      gMax.m_data[3] = local_4c8.m_data[1];
      tcu::Vector<float,_4>::swizzle(&local_4d8,(int)local_60,2,1,0);
      local_438._0_4_ = local_4d8.m_data[0];
      local_438._4_4_ = local_4d8.m_data[1];
      gMax.m_data[0] = local_4d8.m_data[2];
      gMax.m_data[1] = local_4d8.m_data[3];
      break;
    case 7.00649e-45:
      tcu::Vector<float,_4>::swizzle(&local_4e8,(int)&spec + 8,1,2,0);
      gMax.m_data[2] = local_4e8.m_data[0];
      gMax.m_data[3] = local_4e8.m_data[1];
      tcu::Vector<float,_4>::swizzle(&local_4f8,(int)local_60,1,2,0);
      local_438._0_4_ = local_4f8.m_data[0];
      local_438._4_4_ = local_4f8.m_data[1];
      gMax.m_data[0] = local_4f8.m_data[2];
      gMax.m_data[1] = local_4f8.m_data[3];
    }
    pTVar4 = glu::TextureCube::getRefTexture(this->m_texture);
    tcu::TextureCube::allocLevel(pTVar4,(CubeFace)gMin.m_data[2],0);
    pTVar4 = glu::TextureCube::getRefTexture(this->m_texture);
    access = tcu::TextureCube::getLevelFace(pTVar4,0,(CubeFace)gMin.m_data[2]);
    tcu::fillWithComponentGradients(access,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_438);
  }
  glu::TextureCube::upload(this->m_texture);
  this->m_curFace = 0;
  this->m_isOk = true;
  iVar1 = std::__cxx11::ostringstream::~ostringstream(local_1d8);
  return iVar1;
}

Assistant:

void TextureCubeFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= m_dataType ? glu::mapGLTransferFormat(m_format, m_dataType) : glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	if (m_dataType)
		fmtName << glu::getTextureFormatStr(m_format) << ", " << glu::getTypeStr(m_dataType);
	else
		fmtName << glu::getTextureFormatStr(m_format);

	log << TestLog::Message << "Cube map texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	DE_ASSERT(m_width == m_height);
	m_texture = m_dataType != GL_NONE
			  ? new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_width)	// Implicit internal format.
		      : new glu::TextureCube(m_renderCtx, m_format, m_width);				// Explicit internal format.

	// Fill level 0.
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		tcu::Vec4 gMin, gMax;

		switch (face)
		{
			case 0: gMin = spec.valueMin.swizzle(0, 1, 2, 3); gMax = spec.valueMax.swizzle(0, 1, 2, 3); break;
			case 1: gMin = spec.valueMin.swizzle(2, 1, 0, 3); gMax = spec.valueMax.swizzle(2, 1, 0, 3); break;
			case 2: gMin = spec.valueMin.swizzle(1, 2, 0, 3); gMax = spec.valueMax.swizzle(1, 2, 0, 3); break;
			case 3: gMin = spec.valueMax.swizzle(0, 1, 2, 3); gMax = spec.valueMin.swizzle(0, 1, 2, 3); break;
			case 4: gMin = spec.valueMax.swizzle(2, 1, 0, 3); gMax = spec.valueMin.swizzle(2, 1, 0, 3); break;
			case 5: gMin = spec.valueMax.swizzle(1, 2, 0, 3); gMax = spec.valueMin.swizzle(1, 2, 0, 3); break;
			default:
				DE_ASSERT(false);
		}

		m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, 0);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(0, (tcu::CubeFace)face), gMin, gMax);
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}